

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXModule.c
# Opt level: O0

cs_err MOS65XX_global_init(cs_struct *ud)

{
  cs_struct *ud_local;
  cs_err local_4;
  
  if (ud->mode == CS_MODE_ARM) {
    ud->printer = MOS65XX_printInst;
    ud->printer_info = (void *)0x0;
    ud->insn_id = MOS65XX_get_insn_id;
    ud->insn_name = MOS65XX_insn_name;
    ud->group_name = MOS65XX_group_name;
    ud->disasm = MOS65XX_getInstruction;
    ud->reg_name = MOS65XX_reg_name;
    local_4 = CS_ERR_OK;
  }
  else {
    local_4 = CS_ERR_MODE;
  }
  return local_4;
}

Assistant:

cs_err MOS65XX_global_init(cs_struct *ud)
{
	// verify if requested mode is valid
	if (ud->mode)
		return CS_ERR_MODE;

	ud->printer = MOS65XX_printInst;
	ud->printer_info = NULL;
	ud->insn_id = MOS65XX_get_insn_id;
	ud->insn_name = MOS65XX_insn_name;
	ud->group_name = MOS65XX_group_name;
	ud->disasm = MOS65XX_getInstruction;
	ud->reg_name = MOS65XX_reg_name;

	return CS_ERR_OK;
}